

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::ssl_delete(mutex *ctx_mutex,SSL *ssl,bool shutdown_gracefully)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> guard;
  bool shutdown_gracefully_local;
  SSL *ssl_local;
  mutex *ctx_mutex_local;
  
  guard._M_device._7_1_ = shutdown_gracefully;
  if (shutdown_gracefully) {
    SSL_shutdown((SSL *)ssl);
  }
  std::lock_guard<std::mutex>::lock_guard(&local_28,ctx_mutex);
  SSL_free((SSL *)ssl);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

inline void ssl_delete(std::mutex &ctx_mutex, SSL *ssl,
                       bool shutdown_gracefully) {
  // sometimes we may want to skip this to try to avoid SIGPIPE if we know
  // the remote has closed the network connection
  // Note that it is not always possible to avoid SIGPIPE, this is merely a
  // best-efforts.
  if (shutdown_gracefully) { SSL_shutdown(ssl); }

  std::lock_guard<std::mutex> guard(ctx_mutex);
  SSL_free(ssl);
}